

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_HexString<double>_>,_HexString<double>_>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  type *in_RSI;
  QChar **in_stack_ffffffffffffffe8;
  
  QConcatenable<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_HexString<double>_>_>::
  appendTo<QChar>(in_RSI,in_stack_ffffffffffffffe8);
  QConcatenable<HexString<double>_>::appendTo((HexString<double> *)in_RSI,in_stack_ffffffffffffffe8)
  ;
  return;
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }